

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 (*pauVar31) [16];
  int iVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  Scene *pSVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 (*pauVar44) [16];
  ulong uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar51 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar82;
  float fVar83;
  undefined1 auVar79 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  float fVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [64];
  float fVar106;
  float fVar108;
  undefined1 auVar107 [32];
  float fVar109;
  undefined4 uVar110;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [32];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar122 [32];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar127 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_15f0;
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1510 [16];
  Scene *local_1500;
  undefined1 auStack_14f8 [24];
  undefined1 local_14e0 [32];
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float local_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float local_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  undefined1 local_1450 [16];
  undefined1 local_1440 [16];
  undefined1 local_1430 [16];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 local_1400 [16];
  undefined4 uStack_13f0;
  undefined4 uStack_13ec;
  undefined4 uStack_13e8;
  undefined4 uStack_13e4;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [8];
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar44 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar110 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1430._4_4_ = uVar110;
  local_1430._0_4_ = uVar110;
  local_1430._8_4_ = uVar110;
  local_1430._12_4_ = uVar110;
  auVar93 = ZEXT1664(local_1430);
  uVar110 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1440._4_4_ = uVar110;
  local_1440._0_4_ = uVar110;
  local_1440._8_4_ = uVar110;
  local_1440._12_4_ = uVar110;
  auVar94 = ZEXT1664(local_1440);
  uVar110 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1450._4_4_ = uVar110;
  local_1450._0_4_ = uVar110;
  local_1450._8_4_ = uVar110;
  local_1450._12_4_ = uVar110;
  auVar99 = ZEXT1664(local_1450);
  fVar116 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar121 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar126 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar106 = fVar116 * 0.99999964;
  fVar109 = fVar121 * 0.99999964;
  fVar114 = fVar126 * 0.99999964;
  fVar116 = fVar116 * 1.0000004;
  fVar121 = fVar121 * 1.0000004;
  fVar126 = fVar126 * 1.0000004;
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar32 = (tray->tnear).field_0.i[k];
  local_1510._4_4_ = iVar32;
  local_1510._0_4_ = iVar32;
  local_1510._8_4_ = iVar32;
  local_1510._12_4_ = iVar32;
  auVar89 = ZEXT1664(local_1510);
  iVar32 = (tray->tfar).field_0.i[k];
  auVar49 = ZEXT1664(CONCAT412(iVar32,CONCAT48(iVar32,CONCAT44(iVar32,iVar32))));
  local_1200._16_16_ = mm_lookupmask_ps._240_16_;
  local_1200._0_16_ = mm_lookupmask_ps._0_16_;
  iVar32 = 1 << ((uint)k & 0x1f);
  auVar52._4_4_ = iVar32;
  auVar52._0_4_ = iVar32;
  auVar52._8_4_ = iVar32;
  auVar52._12_4_ = iVar32;
  auVar52._16_4_ = iVar32;
  auVar52._20_4_ = iVar32;
  auVar52._24_4_ = iVar32;
  auVar52._28_4_ = iVar32;
  auVar53 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar52 = vpand_avx2(auVar52,auVar53);
  local_1240 = vpcmpeqd_avx2(auVar52,auVar53);
  auVar59._8_4_ = 0x3f800000;
  auVar59._0_8_ = 0x3f8000003f800000;
  auVar59._12_4_ = 0x3f800000;
  auVar59._16_4_ = 0x3f800000;
  auVar59._20_4_ = 0x3f800000;
  auVar59._24_4_ = 0x3f800000;
  auVar59._28_4_ = 0x3f800000;
  auVar53._8_4_ = 0xbf800000;
  auVar53._0_8_ = 0xbf800000bf800000;
  auVar53._12_4_ = 0xbf800000;
  auVar53._16_4_ = 0xbf800000;
  auVar53._20_4_ = 0xbf800000;
  auVar53._24_4_ = 0xbf800000;
  auVar53._28_4_ = 0xbf800000;
  _local_1220 = vblendvps_avx(auVar59,auVar53,local_1200);
  fVar108 = fVar106;
  fVar95 = fVar106;
  fVar82 = fVar106;
  fVar83 = fVar109;
  fVar84 = fVar109;
  fVar85 = fVar109;
  fVar86 = fVar114;
  fVar87 = fVar114;
  fVar115 = fVar114;
  fVar118 = fVar116;
  fVar119 = fVar116;
  fVar120 = fVar116;
  fVar123 = fVar121;
  fVar124 = fVar121;
  fVar125 = fVar121;
  fVar128 = fVar126;
  fVar129 = fVar126;
  fVar130 = fVar126;
  local_14b0 = fVar126;
  fStack_14ac = fVar126;
  fStack_14a8 = fVar126;
  fStack_14a4 = fVar126;
  local_14a0 = fVar121;
  fStack_149c = fVar121;
  fStack_1498 = fVar121;
  fStack_1494 = fVar121;
  local_1490 = fVar116;
  fStack_148c = fVar116;
  fStack_1488 = fVar116;
  fStack_1484 = fVar116;
  local_1480 = fVar114;
  fStack_147c = fVar114;
  fStack_1478 = fVar114;
  fStack_1474 = fVar114;
  local_1470 = fVar109;
  fStack_146c = fVar109;
  fStack_1468 = fVar109;
  fStack_1464 = fVar109;
  local_1460 = fVar106;
  fStack_145c = fVar106;
  fStack_1458 = fVar106;
  fStack_1454 = fVar106;
LAB_01602dfa:
  do {
    do {
      if (pauVar44 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar31 = pauVar44 + -1;
      pauVar44 = pauVar44 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar31 + 8));
    uVar35 = *(ulong *)*pauVar44;
    while ((uVar35 & 8) == 0) {
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + uVar43),auVar93._0_16_);
      auVar50._0_4_ = fVar106 * auVar51._0_4_;
      auVar50._4_4_ = fVar108 * auVar51._4_4_;
      auVar50._8_4_ = fVar95 * auVar51._8_4_;
      auVar50._12_4_ = fVar82 * auVar51._12_4_;
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + uVar42),auVar94._0_16_);
      auVar62._0_4_ = fVar109 * auVar51._0_4_;
      auVar62._4_4_ = fVar83 * auVar51._4_4_;
      auVar62._8_4_ = fVar84 * auVar51._8_4_;
      auVar62._12_4_ = fVar85 * auVar51._12_4_;
      auVar51 = vmaxps_avx(auVar50,auVar62);
      auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + uVar40),auVar99._0_16_);
      auVar63._0_4_ = fVar114 * auVar50._0_4_;
      auVar63._4_4_ = fVar86 * auVar50._4_4_;
      auVar63._8_4_ = fVar87 * auVar50._8_4_;
      auVar63._12_4_ = fVar115 * auVar50._12_4_;
      auVar50 = vmaxps_avx(auVar63,auVar89._0_16_);
      local_1400 = vmaxps_avx(auVar51,auVar50);
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + (uVar43 ^ 0x10)),auVar93._0_16_);
      auVar64._0_4_ = fVar116 * auVar51._0_4_;
      auVar64._4_4_ = fVar118 * auVar51._4_4_;
      auVar64._8_4_ = fVar119 * auVar51._8_4_;
      auVar64._12_4_ = fVar120 * auVar51._12_4_;
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + (uVar42 ^ 0x10)),auVar94._0_16_);
      auVar68._0_4_ = fVar121 * auVar51._0_4_;
      auVar68._4_4_ = fVar123 * auVar51._4_4_;
      auVar68._8_4_ = fVar124 * auVar51._8_4_;
      auVar68._12_4_ = fVar125 * auVar51._12_4_;
      auVar51 = vminps_avx(auVar64,auVar68);
      auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar35 + 0x20 + (uVar40 ^ 0x10)),auVar99._0_16_);
      auVar69._0_4_ = fVar126 * auVar50._0_4_;
      auVar69._4_4_ = fVar128 * auVar50._4_4_;
      auVar69._8_4_ = fVar129 * auVar50._8_4_;
      auVar69._12_4_ = fVar130 * auVar50._12_4_;
      auVar50 = vminps_avx(auVar69,auVar49._0_16_);
      auVar51 = vminps_avx(auVar51,auVar50);
      auVar51 = vcmpps_avx(local_1400,auVar51,2);
      uVar33 = vmovmskps_avx(auVar51);
      if (uVar33 == 0) goto LAB_01602dfa;
      uVar33 = uVar33 & 0xff;
      uVar45 = uVar35 & 0xfffffffffffffff0;
      lVar41 = 0;
      for (uVar35 = (ulong)uVar33; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar41 = lVar41 + 1;
      }
      uVar35 = *(ulong *)(uVar45 + lVar41 * 8);
      uVar33 = uVar33 - 1 & uVar33;
      uVar37 = (ulong)uVar33;
      if (uVar33 != 0) {
        uVar34 = *(uint *)(local_1400 + lVar41 * 4);
        lVar41 = 0;
        for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          lVar41 = lVar41 + 1;
        }
        uVar33 = uVar33 - 1 & uVar33;
        uVar38 = (ulong)uVar33;
        uVar37 = *(ulong *)(uVar45 + lVar41 * 8);
        uVar3 = *(uint *)(local_1400 + lVar41 * 4);
        if (uVar33 == 0) {
          if (uVar34 < uVar3) {
            *(ulong *)*pauVar44 = uVar37;
            *(uint *)(*pauVar44 + 8) = uVar3;
            pauVar44 = pauVar44 + 1;
          }
          else {
            *(ulong *)*pauVar44 = uVar35;
            *(uint *)(*pauVar44 + 8) = uVar34;
            pauVar44 = pauVar44 + 1;
            uVar35 = uVar37;
          }
        }
        else {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar35;
          auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar34));
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar37;
          auVar50 = vpunpcklqdq_avx(auVar65,ZEXT416(uVar3));
          lVar41 = 0;
          for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
            lVar41 = lVar41 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          uVar35 = (ulong)uVar33;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)(uVar45 + lVar41 * 8);
          auVar63 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_1400 + lVar41 * 4)));
          auVar62 = vpcmpgtd_avx(auVar50,auVar51);
          if (uVar33 == 0) {
            auVar64 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar50,auVar51,auVar64);
            auVar51 = vblendvps_avx(auVar51,auVar50,auVar64);
            auVar50 = vpcmpgtd_avx(auVar63,auVar62);
            auVar64 = vpshufd_avx(auVar50,0xaa);
            auVar50 = vblendvps_avx(auVar63,auVar62,auVar64);
            auVar62 = vblendvps_avx(auVar62,auVar63,auVar64);
            auVar63 = vpcmpgtd_avx(auVar62,auVar51);
            auVar64 = vpshufd_avx(auVar63,0xaa);
            auVar63 = vblendvps_avx(auVar62,auVar51,auVar64);
            auVar51 = vblendvps_avx(auVar51,auVar62,auVar64);
            *pauVar44 = auVar51;
            pauVar44[1] = auVar63;
            uVar35 = auVar50._0_8_;
            pauVar44 = pauVar44 + 2;
          }
          else {
            lVar41 = 0;
            for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              lVar41 = lVar41 + 1;
            }
            auVar79._8_8_ = 0;
            auVar79._0_8_ = *(ulong *)(uVar45 + lVar41 * 8);
            auVar68 = vpunpcklqdq_avx(auVar79,ZEXT416(*(uint *)(local_1400 + lVar41 * 4)));
            auVar64 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar50,auVar51,auVar64);
            auVar51 = vblendvps_avx(auVar51,auVar50,auVar64);
            auVar50 = vpcmpgtd_avx(auVar68,auVar63);
            auVar64 = vpshufd_avx(auVar50,0xaa);
            auVar50 = vblendvps_avx(auVar68,auVar63,auVar64);
            auVar63 = vblendvps_avx(auVar63,auVar68,auVar64);
            auVar64 = vpcmpgtd_avx(auVar63,auVar51);
            auVar68 = vpshufd_avx(auVar64,0xaa);
            auVar64 = vblendvps_avx(auVar63,auVar51,auVar68);
            auVar51 = vblendvps_avx(auVar51,auVar63,auVar68);
            auVar63 = vpcmpgtd_avx(auVar50,auVar62);
            auVar68 = vpshufd_avx(auVar63,0xaa);
            auVar63 = vblendvps_avx(auVar50,auVar62,auVar68);
            auVar50 = vblendvps_avx(auVar62,auVar50,auVar68);
            auVar62 = vpcmpgtd_avx(auVar64,auVar50);
            auVar68 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar64,auVar50,auVar68);
            auVar50 = vblendvps_avx(auVar50,auVar64,auVar68);
            *pauVar44 = auVar51;
            pauVar44[1] = auVar50;
            pauVar44[2] = auVar62;
            auVar89 = ZEXT1664(local_1510);
            uVar35 = auVar63._0_8_;
            pauVar44 = pauVar44 + 3;
          }
        }
      }
    }
    uVar45 = uVar35 & 0xfffffffffffffff0;
    for (lVar41 = 0; lVar41 != (ulong)((uint)uVar35 & 0xf) - 8; lVar41 = lVar41 + 1) {
      lVar36 = lVar41 * 0xe0;
      lVar1 = uVar45 + 0xd0 + lVar36;
      local_1420 = *(undefined8 *)(lVar1 + 0x10);
      uStack_1418 = *(undefined8 *)(lVar1 + 0x18);
      lVar1 = uVar45 + 0xc0 + lVar36;
      local_10e0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
      uStack_10d0 = local_10e0;
      uStack_10c8 = uStack_10d8;
      uStack_1410 = local_1420;
      uStack_1408 = uStack_1418;
      auVar71._16_16_ = *(undefined1 (*) [16])(uVar45 + 0x60 + lVar36);
      auVar71._0_16_ = *(undefined1 (*) [16])(uVar45 + lVar36);
      auVar54._16_16_ = *(undefined1 (*) [16])(uVar45 + 0x70 + lVar36);
      auVar54._0_16_ = *(undefined1 (*) [16])(uVar45 + 0x10 + lVar36);
      auVar66._16_16_ = *(undefined1 (*) [16])(uVar45 + 0x80 + lVar36);
      auVar66._0_16_ = *(undefined1 (*) [16])(uVar45 + 0x20 + lVar36);
      auVar51 = *(undefined1 (*) [16])(uVar45 + 0x30 + lVar36);
      auVar88._16_16_ = auVar51;
      auVar88._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar45 + 0x40 + lVar36);
      auVar74._16_16_ = auVar51;
      auVar74._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar45 + 0x50 + lVar36);
      auVar80._16_16_ = auVar51;
      auVar80._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar45 + 0x90 + lVar36);
      auVar90._16_16_ = auVar51;
      auVar90._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar45 + 0xa0 + lVar36);
      auVar127._16_16_ = auVar51;
      auVar127._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar45 + 0xb0 + lVar36);
      auVar46._16_16_ = auVar51;
      auVar46._0_16_ = auVar51;
      uVar110 = *(undefined4 *)(ray + k * 4);
      auVar111._4_4_ = uVar110;
      auVar111._0_4_ = uVar110;
      auVar111._8_4_ = uVar110;
      auVar111._12_4_ = uVar110;
      auVar111._16_4_ = uVar110;
      auVar111._20_4_ = uVar110;
      auVar111._24_4_ = uVar110;
      auVar111._28_4_ = uVar110;
      uVar110 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar117._4_4_ = uVar110;
      auVar117._0_4_ = uVar110;
      auVar117._8_4_ = uVar110;
      auVar117._12_4_ = uVar110;
      auVar117._16_4_ = uVar110;
      auVar117._20_4_ = uVar110;
      auVar117._24_4_ = uVar110;
      auVar117._28_4_ = uVar110;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar122._4_4_ = uVar2;
      auVar122._0_4_ = uVar2;
      auVar122._8_4_ = uVar2;
      auVar122._12_4_ = uVar2;
      auVar122._16_4_ = uVar2;
      auVar122._20_4_ = uVar2;
      auVar122._24_4_ = uVar2;
      auVar122._28_4_ = uVar2;
      local_1560 = vsubps_avx(auVar71,auVar111);
      auVar54 = vsubps_avx(auVar54,auVar117);
      local_1580 = vsubps_avx(auVar66,auVar122);
      auVar52 = vsubps_avx(auVar88,auVar111);
      auVar53 = vsubps_avx(auVar74,auVar117);
      auVar59 = vsubps_avx(auVar80,auVar122);
      auVar66 = vsubps_avx(auVar90,auVar111);
      auVar71 = vsubps_avx(auVar127,auVar117);
      auVar11 = vsubps_avx(auVar46,auVar122);
      auVar46 = vsubps_avx(auVar66,local_1560);
      local_1100 = vsubps_avx(auVar71,auVar54);
      auVar74 = vsubps_avx(auVar11,local_1580);
      auVar47._0_4_ = local_1560._0_4_ + auVar66._0_4_;
      auVar47._4_4_ = local_1560._4_4_ + auVar66._4_4_;
      auVar47._8_4_ = local_1560._8_4_ + auVar66._8_4_;
      auVar47._12_4_ = local_1560._12_4_ + auVar66._12_4_;
      auVar47._16_4_ = local_1560._16_4_ + auVar66._16_4_;
      auVar47._20_4_ = local_1560._20_4_ + auVar66._20_4_;
      auVar47._24_4_ = local_1560._24_4_ + auVar66._24_4_;
      auVar47._28_4_ = local_1560._28_4_ + auVar66._28_4_;
      auVar91._0_4_ = auVar71._0_4_ + auVar54._0_4_;
      auVar91._4_4_ = auVar71._4_4_ + auVar54._4_4_;
      auVar91._8_4_ = auVar71._8_4_ + auVar54._8_4_;
      auVar91._12_4_ = auVar71._12_4_ + auVar54._12_4_;
      auVar91._16_4_ = auVar71._16_4_ + auVar54._16_4_;
      auVar91._20_4_ = auVar71._20_4_ + auVar54._20_4_;
      auVar91._24_4_ = auVar71._24_4_ + auVar54._24_4_;
      auVar91._28_4_ = auVar71._28_4_ + auVar54._28_4_;
      fVar116 = local_1580._0_4_;
      auVar75._0_4_ = auVar11._0_4_ + fVar116;
      fVar121 = local_1580._4_4_;
      auVar75._4_4_ = auVar11._4_4_ + fVar121;
      fVar126 = local_1580._8_4_;
      auVar75._8_4_ = auVar11._8_4_ + fVar126;
      fVar106 = local_1580._12_4_;
      auVar75._12_4_ = auVar11._12_4_ + fVar106;
      fVar109 = local_1580._16_4_;
      auVar75._16_4_ = auVar11._16_4_ + fVar109;
      fVar114 = local_1580._20_4_;
      auVar75._20_4_ = auVar11._20_4_ + fVar114;
      fVar108 = local_1580._24_4_;
      auVar75._24_4_ = auVar11._24_4_ + fVar108;
      fVar100 = auVar11._28_4_;
      auVar75._28_4_ = fVar100 + local_1580._28_4_;
      auVar12._4_4_ = auVar74._4_4_ * auVar91._4_4_;
      auVar12._0_4_ = auVar74._0_4_ * auVar91._0_4_;
      auVar12._8_4_ = auVar74._8_4_ * auVar91._8_4_;
      auVar12._12_4_ = auVar74._12_4_ * auVar91._12_4_;
      auVar12._16_4_ = auVar74._16_4_ * auVar91._16_4_;
      auVar12._20_4_ = auVar74._20_4_ * auVar91._20_4_;
      auVar12._24_4_ = auVar74._24_4_ * auVar91._24_4_;
      auVar12._28_4_ = uVar110;
      auVar50 = vfmsub231ps_fma(auVar12,local_1100,auVar75);
      auVar13._4_4_ = auVar46._4_4_ * auVar75._4_4_;
      auVar13._0_4_ = auVar46._0_4_ * auVar75._0_4_;
      auVar13._8_4_ = auVar46._8_4_ * auVar75._8_4_;
      auVar13._12_4_ = auVar46._12_4_ * auVar75._12_4_;
      auVar13._16_4_ = auVar46._16_4_ * auVar75._16_4_;
      auVar13._20_4_ = auVar46._20_4_ * auVar75._20_4_;
      auVar13._24_4_ = auVar46._24_4_ * auVar75._24_4_;
      auVar13._28_4_ = auVar75._28_4_;
      auVar51 = vfmsub231ps_fma(auVar13,auVar74,auVar47);
      auVar14._4_4_ = local_1100._4_4_ * auVar47._4_4_;
      auVar14._0_4_ = local_1100._0_4_ * auVar47._0_4_;
      auVar14._8_4_ = local_1100._8_4_ * auVar47._8_4_;
      auVar14._12_4_ = local_1100._12_4_ * auVar47._12_4_;
      auVar14._16_4_ = local_1100._16_4_ * auVar47._16_4_;
      auVar14._20_4_ = local_1100._20_4_ * auVar47._20_4_;
      auVar14._24_4_ = local_1100._24_4_ * auVar47._24_4_;
      auVar14._28_4_ = auVar47._28_4_;
      auVar62 = vfmsub231ps_fma(auVar14,auVar46,auVar91);
      uVar110 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar112._4_4_ = uVar110;
      auVar112._0_4_ = uVar110;
      auVar112._8_4_ = uVar110;
      auVar112._12_4_ = uVar110;
      auVar112._16_4_ = uVar110;
      auVar112._20_4_ = uVar110;
      auVar112._24_4_ = uVar110;
      auVar112._28_4_ = uVar110;
      local_1140 = *(float *)(ray + k * 4 + 0xc0);
      auVar15._4_4_ = local_1140 * auVar62._4_4_;
      auVar15._0_4_ = local_1140 * auVar62._0_4_;
      auVar15._8_4_ = local_1140 * auVar62._8_4_;
      auVar15._12_4_ = local_1140 * auVar62._12_4_;
      auVar15._16_4_ = local_1140 * 0.0;
      auVar15._20_4_ = local_1140 * 0.0;
      auVar15._24_4_ = local_1140 * 0.0;
      auVar15._28_4_ = fVar100;
      auVar51 = vfmadd231ps_fma(auVar15,auVar112,ZEXT1632(auVar51));
      uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_1120._4_4_ = uVar110;
      local_1120._0_4_ = uVar110;
      local_1120._8_4_ = uVar110;
      local_1120._12_4_ = uVar110;
      local_1120._16_4_ = uVar110;
      local_1120._20_4_ = uVar110;
      local_1120._24_4_ = uVar110;
      local_1120._28_4_ = uVar110;
      local_1400 = vfmadd231ps_fma(ZEXT1632(auVar51),local_1120,ZEXT1632(auVar50));
      local_1160 = vsubps_avx(auVar54,auVar53);
      local_1180 = vsubps_avx(local_1580,auVar59);
      auVar55._0_4_ = auVar53._0_4_ + auVar54._0_4_;
      auVar55._4_4_ = auVar53._4_4_ + auVar54._4_4_;
      auVar55._8_4_ = auVar53._8_4_ + auVar54._8_4_;
      auVar55._12_4_ = auVar53._12_4_ + auVar54._12_4_;
      auVar55._16_4_ = auVar53._16_4_ + auVar54._16_4_;
      auVar55._20_4_ = auVar53._20_4_ + auVar54._20_4_;
      auVar55._24_4_ = auVar53._24_4_ + auVar54._24_4_;
      auVar55._28_4_ = auVar53._28_4_ + auVar54._28_4_;
      auVar76._0_4_ = fVar116 + auVar59._0_4_;
      auVar76._4_4_ = fVar121 + auVar59._4_4_;
      auVar76._8_4_ = fVar126 + auVar59._8_4_;
      auVar76._12_4_ = fVar106 + auVar59._12_4_;
      auVar76._16_4_ = fVar109 + auVar59._16_4_;
      auVar76._20_4_ = fVar114 + auVar59._20_4_;
      auVar76._24_4_ = fVar108 + auVar59._24_4_;
      fVar95 = auVar59._28_4_;
      auVar76._28_4_ = local_1580._28_4_ + fVar95;
      fVar82 = local_1180._0_4_;
      fVar85 = local_1180._4_4_;
      auVar16._4_4_ = auVar55._4_4_ * fVar85;
      auVar16._0_4_ = auVar55._0_4_ * fVar82;
      fVar115 = local_1180._8_4_;
      auVar16._8_4_ = auVar55._8_4_ * fVar115;
      fVar120 = local_1180._12_4_;
      auVar16._12_4_ = auVar55._12_4_ * fVar120;
      fVar125 = local_1180._16_4_;
      auVar16._16_4_ = auVar55._16_4_ * fVar125;
      fVar130 = local_1180._20_4_;
      auVar16._20_4_ = auVar55._20_4_ * fVar130;
      fVar8 = local_1180._24_4_;
      auVar16._24_4_ = auVar55._24_4_ * fVar8;
      auVar16._28_4_ = auVar91._28_4_;
      auVar50 = vfmsub231ps_fma(auVar16,local_1160,auVar76);
      local_11a0 = vsubps_avx(local_1560,auVar52);
      fVar83 = local_11a0._0_4_;
      fVar86 = local_11a0._4_4_;
      auVar17._4_4_ = auVar76._4_4_ * fVar86;
      auVar17._0_4_ = auVar76._0_4_ * fVar83;
      fVar118 = local_11a0._8_4_;
      auVar17._8_4_ = auVar76._8_4_ * fVar118;
      fVar123 = local_11a0._12_4_;
      auVar17._12_4_ = auVar76._12_4_ * fVar123;
      fVar128 = local_11a0._16_4_;
      auVar17._16_4_ = auVar76._16_4_ * fVar128;
      fVar6 = local_11a0._20_4_;
      auVar17._20_4_ = auVar76._20_4_ * fVar6;
      fVar9 = local_11a0._24_4_;
      auVar17._24_4_ = auVar76._24_4_ * fVar9;
      auVar17._28_4_ = auVar76._28_4_;
      auVar96._0_4_ = local_1560._0_4_ + auVar52._0_4_;
      auVar96._4_4_ = local_1560._4_4_ + auVar52._4_4_;
      auVar96._8_4_ = local_1560._8_4_ + auVar52._8_4_;
      auVar96._12_4_ = local_1560._12_4_ + auVar52._12_4_;
      auVar96._16_4_ = local_1560._16_4_ + auVar52._16_4_;
      auVar96._20_4_ = local_1560._20_4_ + auVar52._20_4_;
      auVar96._24_4_ = local_1560._24_4_ + auVar52._24_4_;
      auVar96._28_4_ = local_1560._28_4_ + auVar52._28_4_;
      auVar51 = vfmsub231ps_fma(auVar17,local_1180,auVar96);
      fVar84 = local_1160._0_4_;
      fVar87 = local_1160._4_4_;
      auVar18._4_4_ = auVar96._4_4_ * fVar87;
      auVar18._0_4_ = auVar96._0_4_ * fVar84;
      fVar119 = local_1160._8_4_;
      auVar18._8_4_ = auVar96._8_4_ * fVar119;
      fVar124 = local_1160._12_4_;
      auVar18._12_4_ = auVar96._12_4_ * fVar124;
      fVar129 = local_1160._16_4_;
      auVar18._16_4_ = auVar96._16_4_ * fVar129;
      fVar7 = local_1160._20_4_;
      auVar18._20_4_ = auVar96._20_4_ * fVar7;
      fVar10 = local_1160._24_4_;
      auVar18._24_4_ = auVar96._24_4_ * fVar10;
      auVar18._28_4_ = auVar96._28_4_;
      auVar62 = vfmsub231ps_fma(auVar18,local_11a0,auVar55);
      auVar97._0_4_ = auVar62._0_4_ * local_1140;
      auVar97._4_4_ = auVar62._4_4_ * local_1140;
      auVar97._8_4_ = auVar62._8_4_ * local_1140;
      auVar97._12_4_ = auVar62._12_4_ * local_1140;
      auVar97._16_4_ = local_1140 * 0.0;
      auVar97._20_4_ = local_1140 * 0.0;
      auVar97._24_4_ = local_1140 * 0.0;
      auVar97._28_4_ = 0;
      auVar51 = vfmadd231ps_fma(auVar97,auVar112,ZEXT1632(auVar51));
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),local_1120,ZEXT1632(auVar50));
      auVar12 = vsubps_avx(auVar52,auVar66);
      auVar72._0_4_ = auVar52._0_4_ + auVar66._0_4_;
      auVar72._4_4_ = auVar52._4_4_ + auVar66._4_4_;
      auVar72._8_4_ = auVar52._8_4_ + auVar66._8_4_;
      auVar72._12_4_ = auVar52._12_4_ + auVar66._12_4_;
      auVar72._16_4_ = auVar52._16_4_ + auVar66._16_4_;
      auVar72._20_4_ = auVar52._20_4_ + auVar66._20_4_;
      auVar72._24_4_ = auVar52._24_4_ + auVar66._24_4_;
      auVar72._28_4_ = auVar52._28_4_ + auVar66._28_4_;
      auVar66 = vsubps_avx(auVar53,auVar71);
      auVar81._0_4_ = auVar53._0_4_ + auVar71._0_4_;
      auVar81._4_4_ = auVar53._4_4_ + auVar71._4_4_;
      auVar81._8_4_ = auVar53._8_4_ + auVar71._8_4_;
      auVar81._12_4_ = auVar53._12_4_ + auVar71._12_4_;
      auVar81._16_4_ = auVar53._16_4_ + auVar71._16_4_;
      auVar81._20_4_ = auVar53._20_4_ + auVar71._20_4_;
      auVar81._24_4_ = auVar53._24_4_ + auVar71._24_4_;
      auVar81._28_4_ = auVar53._28_4_ + auVar71._28_4_;
      auVar71 = vsubps_avx(auVar59,auVar11);
      auVar56._0_4_ = auVar59._0_4_ + auVar11._0_4_;
      auVar56._4_4_ = auVar59._4_4_ + auVar11._4_4_;
      auVar56._8_4_ = auVar59._8_4_ + auVar11._8_4_;
      auVar56._12_4_ = auVar59._12_4_ + auVar11._12_4_;
      auVar56._16_4_ = auVar59._16_4_ + auVar11._16_4_;
      auVar56._20_4_ = auVar59._20_4_ + auVar11._20_4_;
      auVar56._24_4_ = auVar59._24_4_ + auVar11._24_4_;
      auVar56._28_4_ = fVar95 + fVar100;
      auVar11._4_4_ = auVar71._4_4_ * auVar81._4_4_;
      auVar11._0_4_ = auVar71._0_4_ * auVar81._0_4_;
      auVar11._8_4_ = auVar71._8_4_ * auVar81._8_4_;
      auVar11._12_4_ = auVar71._12_4_ * auVar81._12_4_;
      auVar11._16_4_ = auVar71._16_4_ * auVar81._16_4_;
      auVar11._20_4_ = auVar71._20_4_ * auVar81._20_4_;
      auVar11._24_4_ = auVar71._24_4_ * auVar81._24_4_;
      auVar11._28_4_ = fVar95;
      auVar62 = vfmsub231ps_fma(auVar11,auVar66,auVar56);
      auVar19._4_4_ = auVar56._4_4_ * auVar12._4_4_;
      auVar19._0_4_ = auVar56._0_4_ * auVar12._0_4_;
      auVar19._8_4_ = auVar56._8_4_ * auVar12._8_4_;
      auVar19._12_4_ = auVar56._12_4_ * auVar12._12_4_;
      auVar19._16_4_ = auVar56._16_4_ * auVar12._16_4_;
      auVar19._20_4_ = auVar56._20_4_ * auVar12._20_4_;
      auVar19._24_4_ = auVar56._24_4_ * auVar12._24_4_;
      auVar19._28_4_ = auVar56._28_4_;
      auVar50 = vfmsub231ps_fma(auVar19,auVar71,auVar72);
      auVar20._4_4_ = auVar66._4_4_ * auVar72._4_4_;
      auVar20._0_4_ = auVar66._0_4_ * auVar72._0_4_;
      auVar20._8_4_ = auVar66._8_4_ * auVar72._8_4_;
      auVar20._12_4_ = auVar66._12_4_ * auVar72._12_4_;
      auVar20._16_4_ = auVar66._16_4_ * auVar72._16_4_;
      auVar20._20_4_ = auVar66._20_4_ * auVar72._20_4_;
      auVar20._24_4_ = auVar66._24_4_ * auVar72._24_4_;
      auVar20._28_4_ = auVar72._28_4_;
      auVar63 = vfmsub231ps_fma(auVar20,auVar12,auVar81);
      fStack_113c = local_1140;
      fStack_1138 = local_1140;
      fStack_1134 = local_1140;
      fStack_1130 = local_1140;
      fStack_112c = local_1140;
      fStack_1128 = local_1140;
      fStack_1124 = local_1140;
      auVar73._0_4_ = local_1140 * auVar63._0_4_;
      auVar73._4_4_ = local_1140 * auVar63._4_4_;
      auVar73._8_4_ = local_1140 * auVar63._8_4_;
      auVar73._12_4_ = local_1140 * auVar63._12_4_;
      auVar73._16_4_ = local_1140 * 0.0;
      auVar73._20_4_ = local_1140 * 0.0;
      auVar73._24_4_ = local_1140 * 0.0;
      auVar73._28_4_ = 0;
      auVar50 = vfmadd231ps_fma(auVar73,auVar112,ZEXT1632(auVar50));
      auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),local_1120,ZEXT1632(auVar62));
      local_13e0 = ZEXT1632(auVar51);
      local_13c0 = ZEXT1632(CONCAT412(auVar50._12_4_ + auVar51._12_4_ + local_1400._12_4_,
                                      CONCAT48(auVar50._8_4_ + auVar51._8_4_ + local_1400._8_4_,
                                               CONCAT44(auVar50._4_4_ +
                                                        auVar51._4_4_ + local_1400._4_4_,
                                                        auVar50._0_4_ +
                                                        auVar51._0_4_ + local_1400._0_4_))));
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      auVar57._16_4_ = 0x7fffffff;
      auVar57._20_4_ = 0x7fffffff;
      auVar57._24_4_ = 0x7fffffff;
      auVar57._28_4_ = 0x7fffffff;
      auVar52 = vminps_avx(ZEXT1632(local_1400),local_13e0);
      auVar52 = vminps_avx(auVar52,ZEXT1632(auVar50));
      local_11e0 = vandps_avx(local_13c0,auVar57);
      fVar95 = local_11e0._0_4_ * 1.1920929e-07;
      fVar100 = local_11e0._4_4_ * 1.1920929e-07;
      auVar21._4_4_ = fVar100;
      auVar21._0_4_ = fVar95;
      fVar101 = local_11e0._8_4_ * 1.1920929e-07;
      auVar21._8_4_ = fVar101;
      fVar102 = local_11e0._12_4_ * 1.1920929e-07;
      auVar21._12_4_ = fVar102;
      fVar103 = local_11e0._16_4_ * 1.1920929e-07;
      auVar21._16_4_ = fVar103;
      fVar104 = local_11e0._20_4_ * 1.1920929e-07;
      auVar21._20_4_ = fVar104;
      fVar105 = local_11e0._24_4_ * 1.1920929e-07;
      auVar21._24_4_ = fVar105;
      auVar21._28_4_ = 0x34000000;
      auVar92._0_8_ = CONCAT44(fVar100,fVar95) ^ 0x8000000080000000;
      auVar92._8_4_ = -fVar101;
      auVar92._12_4_ = -fVar102;
      auVar92._16_4_ = -fVar103;
      auVar92._20_4_ = -fVar104;
      auVar92._24_4_ = -fVar105;
      auVar92._28_4_ = 0xb4000000;
      auVar52 = vcmpps_avx(auVar52,auVar92,5);
      local_11c0 = ZEXT1632(local_1400);
      auVar59 = vmaxps_avx(ZEXT1632(local_1400),local_13e0);
      auVar53 = vmaxps_avx(auVar59,ZEXT1632(auVar50));
      auVar53 = vcmpps_avx(auVar53,auVar21,2);
      auVar53 = vorps_avx(auVar52,auVar53);
      if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar53 >> 0x7f,0) != '\0') ||
            (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar53 >> 0xbf,0) != '\0') ||
          (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar53[0x1f] < '\0') {
        auVar22._4_4_ = fVar87 * auVar74._4_4_;
        auVar22._0_4_ = fVar84 * auVar74._0_4_;
        auVar22._8_4_ = fVar119 * auVar74._8_4_;
        auVar22._12_4_ = fVar124 * auVar74._12_4_;
        auVar22._16_4_ = fVar129 * auVar74._16_4_;
        auVar22._20_4_ = fVar7 * auVar74._20_4_;
        auVar22._24_4_ = fVar10 * auVar74._24_4_;
        auVar22._28_4_ = auVar52._28_4_;
        auVar23._4_4_ = fVar86 * local_1100._4_4_;
        auVar23._0_4_ = fVar83 * local_1100._0_4_;
        auVar23._8_4_ = fVar118 * local_1100._8_4_;
        auVar23._12_4_ = fVar123 * local_1100._12_4_;
        auVar23._16_4_ = fVar128 * local_1100._16_4_;
        auVar23._20_4_ = fVar6 * local_1100._20_4_;
        auVar23._24_4_ = fVar9 * local_1100._24_4_;
        auVar23._28_4_ = 0x34000000;
        auVar50 = vfmsub213ps_fma(local_1100,local_1180,auVar22);
        auVar24._4_4_ = auVar66._4_4_ * fVar85;
        auVar24._0_4_ = auVar66._0_4_ * fVar82;
        auVar24._8_4_ = auVar66._8_4_ * fVar115;
        auVar24._12_4_ = auVar66._12_4_ * fVar120;
        auVar24._16_4_ = auVar66._16_4_ * fVar125;
        auVar24._20_4_ = auVar66._20_4_ * fVar130;
        auVar24._24_4_ = auVar66._24_4_ * fVar8;
        auVar24._28_4_ = auVar59._28_4_;
        auVar25._4_4_ = fVar86 * auVar71._4_4_;
        auVar25._0_4_ = fVar83 * auVar71._0_4_;
        auVar25._8_4_ = fVar118 * auVar71._8_4_;
        auVar25._12_4_ = fVar123 * auVar71._12_4_;
        auVar25._16_4_ = fVar128 * auVar71._16_4_;
        auVar25._20_4_ = fVar6 * auVar71._20_4_;
        auVar25._24_4_ = fVar9 * auVar71._24_4_;
        auVar25._28_4_ = local_11e0._28_4_;
        auVar62 = vfmsub213ps_fma(auVar71,local_1160,auVar24);
        auVar52 = vandps_avx(auVar22,auVar57);
        auVar59 = vandps_avx(auVar24,auVar57);
        auVar52 = vcmpps_avx(auVar52,auVar59,1);
        local_13a0 = vblendvps_avx(ZEXT1632(auVar62),ZEXT1632(auVar50),auVar52);
        auVar26._4_4_ = fVar87 * auVar12._4_4_;
        auVar26._0_4_ = fVar84 * auVar12._0_4_;
        auVar26._8_4_ = fVar119 * auVar12._8_4_;
        auVar26._12_4_ = fVar124 * auVar12._12_4_;
        auVar26._16_4_ = fVar129 * auVar12._16_4_;
        auVar26._20_4_ = fVar7 * auVar12._20_4_;
        auVar26._24_4_ = fVar10 * auVar12._24_4_;
        auVar26._28_4_ = auVar52._28_4_;
        auVar50 = vfmsub213ps_fma(auVar12,local_1180,auVar25);
        auVar27._4_4_ = auVar46._4_4_ * fVar85;
        auVar27._0_4_ = auVar46._0_4_ * fVar82;
        auVar27._8_4_ = auVar46._8_4_ * fVar115;
        auVar27._12_4_ = auVar46._12_4_ * fVar120;
        auVar27._16_4_ = auVar46._16_4_ * fVar125;
        auVar27._20_4_ = auVar46._20_4_ * fVar130;
        auVar27._24_4_ = auVar46._24_4_ * fVar8;
        auVar27._28_4_ = auVar59._28_4_;
        auVar62 = vfmsub213ps_fma(auVar74,local_11a0,auVar27);
        auVar52 = vandps_avx(auVar27,auVar57);
        auVar59 = vandps_avx(auVar25,auVar57);
        auVar52 = vcmpps_avx(auVar52,auVar59,1);
        local_1380 = vblendvps_avx(ZEXT1632(auVar50),ZEXT1632(auVar62),auVar52);
        auVar50 = vfmsub213ps_fma(auVar46,local_1160,auVar23);
        auVar62 = vfmsub213ps_fma(auVar66,local_11a0,auVar26);
        auVar52 = vandps_avx(auVar23,auVar57);
        auVar59 = vandps_avx(auVar26,auVar57);
        auVar59 = vcmpps_avx(auVar52,auVar59,1);
        local_1360 = vblendvps_avx(ZEXT1632(auVar62),ZEXT1632(auVar50),auVar59);
        auVar50 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
        fVar95 = local_1360._0_4_;
        auVar58._0_4_ = fVar95 * local_1140;
        fVar82 = local_1360._4_4_;
        auVar58._4_4_ = fVar82 * local_1140;
        fVar83 = local_1360._8_4_;
        auVar58._8_4_ = fVar83 * local_1140;
        fVar84 = local_1360._12_4_;
        auVar58._12_4_ = fVar84 * local_1140;
        fVar85 = local_1360._16_4_;
        auVar58._16_4_ = fVar85 * local_1140;
        fVar86 = local_1360._20_4_;
        auVar58._20_4_ = fVar86 * local_1140;
        fVar87 = local_1360._24_4_;
        auVar58._24_4_ = fVar87 * local_1140;
        auVar58._28_4_ = 0;
        auVar62 = vfmadd213ps_fma(auVar112,local_1380,auVar58);
        auVar62 = vfmadd213ps_fma(local_1120,local_13a0,ZEXT1632(auVar62));
        auVar59 = ZEXT1632(CONCAT412(auVar62._12_4_ + auVar62._12_4_,
                                     CONCAT48(auVar62._8_4_ + auVar62._8_4_,
                                              CONCAT44(auVar62._4_4_ + auVar62._4_4_,
                                                       auVar62._0_4_ + auVar62._0_4_))));
        auVar28._4_4_ = fVar82 * fVar121;
        auVar28._0_4_ = fVar95 * fVar116;
        auVar28._8_4_ = fVar83 * fVar126;
        auVar28._12_4_ = fVar84 * fVar106;
        auVar28._16_4_ = fVar85 * fVar109;
        auVar28._20_4_ = fVar86 * fVar114;
        auVar28._24_4_ = fVar87 * fVar108;
        auVar28._28_4_ = auVar52._28_4_;
        auVar62 = vfmadd213ps_fma(auVar54,local_1380,auVar28);
        auVar63 = vfmadd213ps_fma(local_1560,local_13a0,ZEXT1632(auVar62));
        auVar52 = vrcpps_avx(auVar59);
        auVar107._8_4_ = 0x3f800000;
        auVar107._0_8_ = 0x3f8000003f800000;
        auVar107._12_4_ = 0x3f800000;
        auVar107._16_4_ = 0x3f800000;
        auVar107._20_4_ = 0x3f800000;
        auVar107._24_4_ = 0x3f800000;
        auVar107._28_4_ = 0x3f800000;
        auVar62 = vfnmadd213ps_fma(auVar52,auVar59,auVar107);
        auVar62 = vfmadd132ps_fma(ZEXT1632(auVar62),auVar52,auVar52);
        local_12e0._28_4_ = 0x3f800000;
        local_12e0._0_28_ =
             ZEXT1628(CONCAT412(auVar62._12_4_ * (auVar63._12_4_ + auVar63._12_4_),
                                CONCAT48(auVar62._8_4_ * (auVar63._8_4_ + auVar63._8_4_),
                                         CONCAT44(auVar62._4_4_ * (auVar63._4_4_ + auVar63._4_4_),
                                                  auVar62._0_4_ * (auVar63._0_4_ + auVar63._0_4_))))
                     );
        auVar49 = ZEXT3264(local_12e0);
        uVar110 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar77._4_4_ = uVar110;
        auVar77._0_4_ = uVar110;
        auVar77._8_4_ = uVar110;
        auVar77._12_4_ = uVar110;
        auVar77._16_4_ = uVar110;
        auVar77._20_4_ = uVar110;
        auVar77._24_4_ = uVar110;
        auVar77._28_4_ = uVar110;
        uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar113._4_4_ = uVar110;
        auVar113._0_4_ = uVar110;
        auVar113._8_4_ = uVar110;
        auVar113._12_4_ = uVar110;
        auVar113._16_4_ = uVar110;
        auVar113._20_4_ = uVar110;
        auVar113._24_4_ = uVar110;
        auVar113._28_4_ = uVar110;
        auVar89 = ZEXT3264(auVar113);
        auVar52 = vcmpps_avx(auVar77,local_12e0,2);
        auVar53 = vcmpps_avx(local_12e0,auVar113,2);
        auVar52 = vandps_avx(auVar53,auVar52);
        auVar62 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
        auVar50 = vpand_avx(auVar62,auVar50);
        auVar52 = vpmovsxwd_avx2(auVar50);
        if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar52 >> 0x7f,0) != '\0') ||
              (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar52 >> 0xbf,0) != '\0') ||
            (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar52[0x1f] < '\0') {
          auVar52 = vcmpps_avx(auVar59,_DAT_01f7b000,4);
          auVar62 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
          auVar50 = vpand_avx(auVar50,auVar62);
          local_1540 = vpmovsxwd_avx2(auVar50);
          if ((((((((local_1540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_1540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_1540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_1540 >> 0x7f,0) != '\0') ||
                (local_1540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_1540 >> 0xbf,0) != '\0') ||
              (local_1540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_1540[0x1f] < '\0') {
            uStack_13f0 = 0;
            uStack_13ec = 0;
            uStack_13e8 = 0;
            uStack_13e4 = 0;
            local_1340 = local_1540;
            local_1260 = local_1200;
            pSVar39 = context->scene;
            auVar52 = vrcpps_avx(local_13c0);
            auVar98._8_4_ = 0x3f800000;
            auVar98._0_8_ = 0x3f8000003f800000;
            auVar98._12_4_ = 0x3f800000;
            auVar98._16_4_ = 0x3f800000;
            auVar98._20_4_ = 0x3f800000;
            auVar98._24_4_ = 0x3f800000;
            auVar98._28_4_ = 0x3f800000;
            auVar62 = vfnmadd213ps_fma(local_13c0,auVar52,auVar98);
            auVar62 = vfmadd132ps_fma(ZEXT1632(auVar62),auVar52,auVar52);
            auVar78._8_4_ = 0x219392ef;
            auVar78._0_8_ = 0x219392ef219392ef;
            auVar78._12_4_ = 0x219392ef;
            auVar78._16_4_ = 0x219392ef;
            auVar78._20_4_ = 0x219392ef;
            auVar78._24_4_ = 0x219392ef;
            auVar78._28_4_ = 0x219392ef;
            auVar52 = vcmpps_avx(local_11e0,auVar78,5);
            auVar52 = vandps_avx(auVar52,ZEXT1632(auVar62));
            auVar29._4_4_ = local_1400._4_4_ * auVar52._4_4_;
            auVar29._0_4_ = local_1400._0_4_ * auVar52._0_4_;
            auVar29._8_4_ = local_1400._8_4_ * auVar52._8_4_;
            auVar29._12_4_ = local_1400._12_4_ * auVar52._12_4_;
            auVar29._16_4_ = auVar52._16_4_ * 0.0;
            auVar29._20_4_ = auVar52._20_4_ * 0.0;
            auVar29._24_4_ = auVar52._24_4_ * 0.0;
            auVar29._28_4_ = 0;
            auVar53 = vminps_avx(auVar29,auVar98);
            auVar30._4_4_ = auVar51._4_4_ * auVar52._4_4_;
            auVar30._0_4_ = auVar51._0_4_ * auVar52._0_4_;
            auVar30._8_4_ = auVar51._8_4_ * auVar52._8_4_;
            auVar30._12_4_ = auVar51._12_4_ * auVar52._12_4_;
            auVar30._16_4_ = auVar52._16_4_ * 0.0;
            auVar30._20_4_ = auVar52._20_4_ * 0.0;
            auVar30._24_4_ = auVar52._24_4_ * 0.0;
            auVar30._28_4_ = local_1180._28_4_;
            auVar52 = vminps_avx(auVar30,auVar98);
            auVar59 = vsubps_avx(auVar98,auVar53);
            auVar66 = vsubps_avx(auVar98,auVar52);
            local_1300 = vblendvps_avx(auVar52,auVar59,local_1200);
            local_1320 = vblendvps_avx(auVar53,auVar66,local_1200);
            local_12c0[0] = local_13a0._0_4_ * (float)local_1220._0_4_;
            local_12c0[1] = local_13a0._4_4_ * (float)local_1220._4_4_;
            local_12c0[2] = local_13a0._8_4_ * fStack_1218;
            local_12c0[3] = local_13a0._12_4_ * fStack_1214;
            fStack_12b0 = local_13a0._16_4_ * fStack_1210;
            fStack_12ac = local_13a0._20_4_ * fStack_120c;
            fStack_12a8 = local_13a0._24_4_ * fStack_1208;
            uStack_12a4 = local_1320._28_4_;
            local_12a0[0] = (float)local_1220._0_4_ * local_1380._0_4_;
            local_12a0[1] = (float)local_1220._4_4_ * local_1380._4_4_;
            local_12a0[2] = fStack_1218 * local_1380._8_4_;
            local_12a0[3] = fStack_1214 * local_1380._12_4_;
            fStack_1290 = fStack_1210 * local_1380._16_4_;
            fStack_128c = fStack_120c * local_1380._20_4_;
            fStack_1288 = fStack_1208 * local_1380._24_4_;
            uStack_1284 = local_1300._28_4_;
            local_1280[0] = (float)local_1220._0_4_ * fVar95;
            local_1280[1] = (float)local_1220._4_4_ * fVar82;
            local_1280[2] = fStack_1218 * fVar83;
            local_1280[3] = fStack_1214 * fVar84;
            fStack_1270 = fStack_1210 * fVar85;
            fStack_126c = fStack_120c * fVar86;
            fStack_1268 = fStack_1208 * fVar87;
            uStack_1264 = uStack_1204;
            auVar52 = vpmovsxwd_avx2(auVar50);
            auVar67._8_4_ = 0x7f800000;
            auVar67._0_8_ = 0x7f8000007f800000;
            auVar67._12_4_ = 0x7f800000;
            auVar67._16_4_ = 0x7f800000;
            auVar67._20_4_ = 0x7f800000;
            auVar67._24_4_ = 0x7f800000;
            auVar67._28_4_ = 0x7f800000;
            auVar52 = vblendvps_avx(auVar67,local_12e0,auVar52);
            auVar53 = vshufps_avx(auVar52,auVar52,0xb1);
            auVar53 = vminps_avx(auVar52,auVar53);
            auVar59 = vshufpd_avx(auVar53,auVar53,5);
            auVar53 = vminps_avx(auVar53,auVar59);
            auVar59 = vpermpd_avx2(auVar53,0x4e);
            auVar53 = vminps_avx(auVar53,auVar59);
            auVar52 = vcmpps_avx(auVar52,auVar53,0);
            auVar51 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
            auVar51 = vpand_avx(auVar51,auVar50);
            auVar52 = vpmovsxwd_avx2(auVar51);
            if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar52 >> 0x7f,0) == '\0') &&
                  (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar52 >> 0xbf,0) == '\0') &&
                (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar52[0x1f]) {
              auVar52 = local_1540;
            }
            uVar34 = vmovmskps_avx(auVar52);
            uVar33 = 0;
            for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x80000000) {
              uVar33 = uVar33 + 1;
            }
            auVar52 = vpcmpeqd_avx2(local_1380,local_1380);
            auVar93 = ZEXT3264(auVar52);
            auStack_14f8 = auVar54._8_24_;
            local_1500 = pSVar39;
            do {
              uVar37 = CONCAT44(0,uVar33);
              uVar33 = *(uint *)((long)&local_10e0 + uVar37 * 4);
              pGVar4 = (pSVar39->geometries).items[uVar33].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1540 + uVar37 * 4) = 0;
                pSVar39 = local_1500;
              }
              else {
                local_1560._0_8_ = uVar37;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar110 = *(undefined4 *)(local_1320 + uVar37 * 4);
                  uVar2 = *(undefined4 *)(local_1300 + uVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_12e0 + uVar37 * 4);
                  *(float *)(ray + k * 4 + 0x180) = local_12c0[uVar37];
                  *(float *)(ray + k * 4 + 0x1a0) = local_12a0[uVar37];
                  *(float *)(ray + k * 4 + 0x1c0) = local_1280[uVar37];
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar110;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_1420 + uVar37 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar33;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_1060 = *(undefined4 *)(local_1320 + uVar37 * 4);
                local_1040 = *(undefined4 *)(local_1300 + uVar37 * 4);
                uVar110 = *(undefined4 *)((long)&local_1420 + uVar37 * 4);
                local_1020._4_4_ = uVar110;
                local_1020._0_4_ = uVar110;
                local_1020._8_4_ = uVar110;
                local_1020._12_4_ = uVar110;
                local_1020._16_4_ = uVar110;
                local_1020._20_4_ = uVar110;
                local_1020._24_4_ = uVar110;
                local_1020._28_4_ = uVar110;
                fVar116 = local_12c0[uVar37];
                fVar121 = local_12a0[uVar37];
                local_10a0._4_4_ = fVar121;
                local_10a0._0_4_ = fVar121;
                local_10a0._8_4_ = fVar121;
                local_10a0._12_4_ = fVar121;
                local_10a0._16_4_ = fVar121;
                local_10a0._20_4_ = fVar121;
                local_10a0._24_4_ = fVar121;
                local_10a0._28_4_ = fVar121;
                fVar121 = local_1280[uVar37];
                local_1080._4_4_ = fVar121;
                local_1080._0_4_ = fVar121;
                local_1080._8_4_ = fVar121;
                local_1080._12_4_ = fVar121;
                local_1080._16_4_ = fVar121;
                local_1080._20_4_ = fVar121;
                local_1080._24_4_ = fVar121;
                local_1080._28_4_ = fVar121;
                local_1000._4_4_ = uVar33;
                local_1000._0_4_ = uVar33;
                local_1000._8_4_ = uVar33;
                local_1000._12_4_ = uVar33;
                local_1000._16_4_ = uVar33;
                local_1000._20_4_ = uVar33;
                local_1000._24_4_ = uVar33;
                local_1000._28_4_ = uVar33;
                local_10c0[0] = (RTCHitN)SUB41(fVar116,0);
                local_10c0[1] = (RTCHitN)(char)((uint)fVar116 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)fVar116 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)fVar116 >> 0x18);
                local_10c0[4] = (RTCHitN)SUB41(fVar116,0);
                local_10c0[5] = (RTCHitN)(char)((uint)fVar116 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)fVar116 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)fVar116 >> 0x18);
                local_10c0[8] = (RTCHitN)SUB41(fVar116,0);
                local_10c0[9] = (RTCHitN)(char)((uint)fVar116 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)fVar116 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)fVar116 >> 0x18);
                local_10c0[0xc] = (RTCHitN)SUB41(fVar116,0);
                local_10c0[0xd] = (RTCHitN)(char)((uint)fVar116 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)fVar116 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)fVar116 >> 0x18);
                local_10c0[0x10] = (RTCHitN)SUB41(fVar116,0);
                local_10c0[0x11] = (RTCHitN)(char)((uint)fVar116 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)fVar116 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)fVar116 >> 0x18);
                local_10c0[0x14] = (RTCHitN)SUB41(fVar116,0);
                local_10c0[0x15] = (RTCHitN)(char)((uint)fVar116 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)fVar116 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)fVar116 >> 0x18);
                local_10c0[0x18] = (RTCHitN)SUB41(fVar116,0);
                local_10c0[0x19] = (RTCHitN)(char)((uint)fVar116 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar116 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar116 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)SUB41(fVar116,0);
                local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar116 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar116 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar116 >> 0x18);
                uStack_105c = local_1060;
                uStack_1058 = local_1060;
                uStack_1054 = local_1060;
                uStack_1050 = local_1060;
                uStack_104c = local_1060;
                uStack_1048 = local_1060;
                uStack_1044 = local_1060;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_12e0 + uVar37 * 4);
                local_14e0 = local_1240;
                local_15f0.valid = (int *)local_14e0;
                local_15f0.geometryUserPtr = pGVar4->userPtr;
                local_15f0.context = context->user;
                local_15f0.hit = local_10c0;
                local_15f0.N = 8;
                local_15f0.ray = (RTCRayN *)ray;
                if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_1580._0_8_ = lVar41;
                  local_15a0 = auVar49._0_32_;
                  local_15c0 = auVar89._0_32_;
                  auVar52 = ZEXT1632(auVar93._0_16_);
                  (*pGVar4->intersectionFilterN)(&local_15f0);
                  auVar89 = ZEXT3264(local_15c0);
                  auVar49 = ZEXT3264(local_15a0);
                  auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
                  auVar93 = ZEXT3264(auVar52);
                  lVar41 = local_1580._0_8_;
                }
                auVar53 = vpcmpeqd_avx2(local_14e0,_DAT_01f7b000);
                auVar52 = auVar93._0_32_ & ~auVar53;
                if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar52 >> 0x7f,0) == '\0') &&
                      (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar52 >> 0xbf,0) == '\0') &&
                    (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar52[0x1f]) {
                  auVar53 = auVar53 ^ auVar93._0_32_;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_1580._0_8_ = lVar41;
                    local_15a0 = auVar49._0_32_;
                    local_15c0 = auVar89._0_32_;
                    auVar52 = ZEXT1632(auVar93._0_16_);
                    (*p_Var5)(&local_15f0);
                    auVar89 = ZEXT3264(local_15c0);
                    auVar49 = ZEXT3264(local_15a0);
                    auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
                    auVar93 = ZEXT3264(auVar52);
                    lVar41 = local_1580._0_8_;
                  }
                  auVar59 = vpcmpeqd_avx2(local_14e0,_DAT_01f7b000);
                  auVar53 = auVar59 ^ auVar93._0_32_;
                  auVar52 = auVar93._0_32_ & ~auVar59;
                  if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar52 >> 0x7f,0) != '\0') ||
                        (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar52 >> 0xbf,0) != '\0') ||
                      (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar52[0x1f] < '\0') {
                    auVar61._0_4_ = auVar59._0_4_ ^ auVar93._0_4_;
                    auVar61._4_4_ = auVar59._4_4_ ^ auVar93._4_4_;
                    auVar61._8_4_ = auVar59._8_4_ ^ auVar93._8_4_;
                    auVar61._12_4_ = auVar59._12_4_ ^ auVar93._12_4_;
                    auVar61._16_4_ = auVar59._16_4_ ^ auVar93._16_4_;
                    auVar61._20_4_ = auVar59._20_4_ ^ auVar93._20_4_;
                    auVar61._24_4_ = auVar59._24_4_ ^ auVar93._24_4_;
                    auVar61._28_4_ = auVar59._28_4_ ^ auVar93._28_4_;
                    auVar52 = vmaskmovps_avx(auVar61,*(undefined1 (*) [32])local_15f0.hit);
                    *(undefined1 (*) [32])(local_15f0.ray + 0x180) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar61,*(undefined1 (*) [32])(local_15f0.hit + 0x20));
                    *(undefined1 (*) [32])(local_15f0.ray + 0x1a0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar61,*(undefined1 (*) [32])(local_15f0.hit + 0x40));
                    *(undefined1 (*) [32])(local_15f0.ray + 0x1c0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar61,*(undefined1 (*) [32])(local_15f0.hit + 0x60));
                    *(undefined1 (*) [32])(local_15f0.ray + 0x1e0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar61,*(undefined1 (*) [32])(local_15f0.hit + 0x80));
                    *(undefined1 (*) [32])(local_15f0.ray + 0x200) = auVar52;
                    auVar52 = vpmaskmovd_avx2(auVar61,*(undefined1 (*) [32])(local_15f0.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_15f0.ray + 0x220) = auVar52;
                    auVar52 = vpmaskmovd_avx2(auVar61,*(undefined1 (*) [32])(local_15f0.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_15f0.ray + 0x240) = auVar52;
                    auVar52 = vpmaskmovd_avx2(auVar61,*(undefined1 (*) [32])(local_15f0.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_15f0.ray + 0x260) = auVar52;
                    auVar52 = vpmaskmovd_avx2(auVar61,*(undefined1 (*) [32])(local_15f0.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_15f0.ray + 0x280) = auVar52;
                  }
                }
                pSVar39 = local_1500;
                if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar53 >> 0x7f,0) == '\0') &&
                      (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar53 >> 0xbf,0) == '\0') &&
                    (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar53[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar89._0_4_;
                }
                else {
                  auVar89 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_1540 + local_1560._0_8_ * 4) = 0;
                uVar110 = auVar89._0_4_;
                auVar48._4_4_ = uVar110;
                auVar48._0_4_ = uVar110;
                auVar48._8_4_ = uVar110;
                auVar48._12_4_ = uVar110;
                auVar48._16_4_ = uVar110;
                auVar48._20_4_ = uVar110;
                auVar48._24_4_ = uVar110;
                auVar48._28_4_ = uVar110;
                auVar52 = vcmpps_avx(auVar49._0_32_,auVar48,2);
                local_1540 = vandps_avx(auVar52,local_1540);
              }
              if ((((((((local_1540 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1540 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1540 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1540 >> 0x7f,0) == '\0') &&
                    (local_1540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1540 >> 0xbf,0) == '\0') &&
                  (local_1540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1540[0x1f]) break;
              auVar60._8_4_ = 0x7f800000;
              auVar60._0_8_ = 0x7f8000007f800000;
              auVar60._12_4_ = 0x7f800000;
              auVar60._16_4_ = 0x7f800000;
              auVar60._20_4_ = 0x7f800000;
              auVar60._24_4_ = 0x7f800000;
              auVar60._28_4_ = 0x7f800000;
              auVar52 = vblendvps_avx(auVar60,auVar49._0_32_,local_1540);
              auVar53 = vshufps_avx(auVar52,auVar52,0xb1);
              auVar53 = vminps_avx(auVar52,auVar53);
              auVar59 = vshufpd_avx(auVar53,auVar53,5);
              auVar53 = vminps_avx(auVar53,auVar59);
              auVar59 = vpermpd_avx2(auVar53,0x4e);
              auVar53 = vminps_avx(auVar53,auVar59);
              auVar53 = vcmpps_avx(auVar52,auVar53,0);
              auVar59 = local_1540 & auVar53;
              auVar52 = local_1540;
              if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar59 >> 0x7f,0) != '\0') ||
                    (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar59 >> 0xbf,0) != '\0') ||
                  (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar59[0x1f] < '\0') {
                auVar52 = vandps_avx(auVar53,local_1540);
              }
              uVar34 = vmovmskps_avx(auVar52);
              uVar33 = 0;
              for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x80000000) {
                uVar33 = uVar33 + 1;
              }
            } while( true );
          }
        }
      }
      auVar93 = ZEXT1664(local_1430);
      auVar94 = ZEXT1664(local_1440);
      auVar99 = ZEXT1664(local_1450);
      auVar89 = ZEXT1664(local_1510);
      fVar106 = local_1460;
      fVar108 = fStack_145c;
      fVar95 = fStack_1458;
      fVar82 = fStack_1454;
      fVar109 = local_1470;
      fVar83 = fStack_146c;
      fVar84 = fStack_1468;
      fVar85 = fStack_1464;
      fVar114 = local_1480;
      fVar86 = fStack_147c;
      fVar87 = fStack_1478;
      fVar115 = fStack_1474;
      fVar116 = local_1490;
      fVar118 = fStack_148c;
      fVar119 = fStack_1488;
      fVar120 = fStack_1484;
      fVar121 = local_14a0;
      fVar123 = fStack_149c;
      fVar124 = fStack_1498;
      fVar125 = fStack_1494;
      fVar126 = local_14b0;
      fVar128 = fStack_14ac;
      fVar129 = fStack_14a8;
      fVar130 = fStack_14a4;
    }
    uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar49 = ZEXT1664(CONCAT412(uVar110,CONCAT48(uVar110,CONCAT44(uVar110,uVar110))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }